

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# carver.cpp
# Opt level: O3

Carver * __thiscall carver::Carver::carveImage(Carver *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  CarveMode CVar2;
  uint uVar3;
  _Alloc_hider _Var4;
  uint uVar5;
  out_of_range *this_00;
  long *plVar6;
  undefined8 *puVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var8;
  _Result<std::vector<int,_std::allocator<int>_>_> *p_Var9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar10;
  uint uVar11;
  size_type *psVar12;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  ulong *puVar14;
  ulong uVar15;
  uint uVar16;
  Carver *pCVar17;
  int iVar18;
  Carver *in_RSI;
  undefined8 uVar19;
  vector<int,_std::allocator<int>_> *pvVar20;
  _State_baseV2 *__tmp;
  uint uVar21;
  int v;
  string __str;
  string __str_1;
  shared_ptr<std::__future_base::_State_baseV2> __state;
  future<std::vector<int,_std::allocator<int>_>_> horizontalSeamFuture;
  Mat energyMap;
  future<std::vector<int,_std::allocator<int>_>_> verticalSeamFuture;
  Mat grayscale;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  Carver *local_280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  undefined1 local_258 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_250;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_248 [5];
  long *local_1f8;
  string local_1f0;
  string local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0 [3];
  vector<int,_std::allocator<int>_> local_150;
  string local_138;
  string local_118;
  string local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8 [3];
  vector<int,_std::allocator<int>_> local_78;
  vector<int,_std::allocator<int>_> local_60;
  vector<int,_std::allocator<int>_> local_48;
  
  CVar2 = in_RSI->carveMode_;
  uVar3 = in_RSI->carveCount_;
  local_280 = in_RSI;
  if (uVar3 == 0) {
    iVar18 = 0;
    uVar16 = 0;
    if ((CVar2 & ~BOTH) == VERTICAL) {
      uVar16 = (uint)((float)in_RSI->imageCols_ * in_RSI->carveAmount_);
    }
    in_RSI->vIterations_ = uVar16;
    if (CVar2 - HORIZONTAL < 2) {
      iVar18 = (int)((float)in_RSI->imageRows_ * in_RSI->carveAmount_);
    }
    in_RSI->hIterations_ = iVar18;
  }
  else {
    uVar16 = 0;
    if ((CVar2 & ~BOTH) == VERTICAL) {
      uVar16 = uVar3;
    }
    uVar21 = 0;
    if (CVar2 - HORIZONTAL < 2) {
      uVar21 = uVar3;
    }
    in_RSI->vIterations_ = uVar16;
    in_RSI->hIterations_ = uVar21;
    if ((in_RSI->imageRows_ <= (int)uVar21) || (in_RSI->imageCols_ <= (int)uVar16)) {
      this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
      std::__cxx11::to_string(&local_1f0,in_RSI->carveCount_);
      std::operator+(&local_278,"Number of pixels to carve ",&local_1f0);
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_278);
      local_2a8._M_dataplus._M_p = (pointer)*plVar6;
      psVar12 = (size_type *)(plVar6 + 2);
      if ((size_type *)local_2a8._M_dataplus._M_p == psVar12) {
        local_2a8.field_2._M_allocated_capacity = *psVar12;
        local_2a8.field_2._8_8_ = plVar6[3];
        local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
      }
      else {
        local_2a8.field_2._M_allocated_capacity = *psVar12;
      }
      local_2a8._M_string_length = plVar6[1];
      *plVar6 = (long)psVar12;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      std::__cxx11::to_string(&local_118,local_280->imageCols_);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_258,
                     &local_2a8,&local_118);
      plVar6 = (long *)std::__cxx11::string::append(local_258);
      local_1b0[0]._M_dataplus._M_p = (pointer)*plVar6;
      psVar12 = (size_type *)(plVar6 + 2);
      if ((size_type *)local_1b0[0]._M_dataplus._M_p == psVar12) {
        local_1b0[0].field_2._0_8_ = *psVar12;
        local_1b0[0].field_2._8_8_ = plVar6[3];
        local_1b0[0]._M_dataplus._M_p = (pointer)&local_1b0[0].field_2;
      }
      else {
        local_1b0[0].field_2._0_8_ = *psVar12;
      }
      local_1b0[0]._M_string_length = plVar6[1];
      *plVar6 = (long)psVar12;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      std::__cxx11::to_string(&local_1d0,local_280->imageRows_);
      std::operator+(local_d8,local_1b0,&local_1d0);
      std::out_of_range::out_of_range(this_00,(string *)local_d8);
      __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
    }
  }
  uVar3 = -uVar16;
  if (0 < (int)uVar16) {
    uVar3 = uVar16;
  }
  uVar21 = 1;
  if (9 < uVar3) {
    uVar15 = (ulong)uVar3;
    uVar5 = 4;
    do {
      uVar21 = uVar5;
      uVar11 = (uint)uVar15;
      if (uVar11 < 100) {
        uVar21 = uVar21 - 2;
        goto LAB_00108a05;
      }
      if (uVar11 < 1000) {
        uVar21 = uVar21 - 1;
        goto LAB_00108a05;
      }
      if (uVar11 < 10000) goto LAB_00108a05;
      uVar15 = uVar15 / 10000;
      uVar5 = uVar21 + 4;
    } while (99999 < uVar11);
    uVar21 = uVar21 + 1;
  }
LAB_00108a05:
  local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_2a8,(char)uVar21 - (char)((int)uVar16 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_2a8._M_dataplus._M_p + (uVar16 >> 0x1f),uVar21,uVar3);
  plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_2a8,0,(char *)0x0,0x10c135);
  pCVar17 = local_280;
  paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 == paVar13) {
    local_248[0]._0_8_ = paVar13->_M_allocated_capacity;
    local_248[0]._8_8_ = plVar6[3];
    local_258 = (undefined1  [8])local_248;
  }
  else {
    local_248[0]._0_8_ = paVar13->_M_allocated_capacity;
    local_258 = (undefined1  [8])*plVar6;
  }
  _Stack_250._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar6[1];
  *plVar6 = (long)paVar13;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append(local_258);
  paVar13 = &local_1b0[0].field_2;
  puVar14 = (ulong *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar14) {
    local_1b0[0].field_2._0_8_ = *puVar14;
    local_1b0[0].field_2._8_8_ = plVar6[3];
    local_1b0[0]._M_dataplus._M_p = (pointer)paVar13;
  }
  else {
    local_1b0[0].field_2._0_8_ = *puVar14;
    local_1b0[0]._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_1b0[0]._M_string_length = plVar6[1];
  *plVar6 = (long)puVar14;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  uVar3 = pCVar17->hIterations_;
  uVar16 = -uVar3;
  if (0 < (int)uVar3) {
    uVar16 = uVar3;
  }
  uVar21 = 1;
  if (9 < uVar16) {
    uVar15 = (ulong)uVar16;
    uVar5 = 4;
    do {
      uVar21 = uVar5;
      uVar11 = (uint)uVar15;
      if (uVar11 < 100) {
        uVar21 = uVar21 - 2;
        goto LAB_00108b5c;
      }
      if (uVar11 < 1000) {
        uVar21 = uVar21 - 1;
        goto LAB_00108b5c;
      }
      if (uVar11 < 10000) goto LAB_00108b5c;
      uVar15 = uVar15 / 10000;
      uVar5 = uVar21 + 4;
    } while (99999 < uVar11);
    uVar21 = uVar21 + 1;
  }
LAB_00108b5c:
  paVar1 = &local_278.field_2;
  local_278._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct((ulong)&local_278,(char)uVar21 - (char)((int)uVar3 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_278._M_dataplus._M_p + (uVar3 >> 0x1f),uVar21,uVar16);
  pCVar17 = local_280;
  uVar15 = (long)&(((_Vector_base<int,_std::allocator<int>_> *)local_1b0[0]._M_string_length)->
                  _M_impl).super__Vector_impl_data._M_start +
           (long)(_func_int ***)local_278._M_string_length;
  uVar19 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0[0]._M_dataplus._M_p != paVar13) {
    uVar19 = local_1b0[0].field_2._M_allocated_capacity;
  }
  pvVar20 = (vector<int,_std::allocator<int>_> *)local_1b0[0]._M_string_length;
  if ((ulong)uVar19 < uVar15) {
    uVar19 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_dataplus._M_p != paVar1) {
      uVar19 = local_278.field_2._M_allocated_capacity;
    }
    if (uVar15 <= (ulong)uVar19) {
      puVar7 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_278,0,(char *)0x0,(ulong)local_1b0[0]._M_dataplus._M_p);
      goto LAB_00108bfe;
    }
  }
  puVar7 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)local_1b0,(ulong)local_278._M_dataplus._M_p);
LAB_00108bfe:
  local_d8[0]._M_dataplus._M_p = (pointer)&local_d8[0].field_2;
  psVar12 = puVar7 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar12) {
    local_d8[0].field_2._0_8_ = *psVar12;
    local_d8[0].field_2._8_8_ = puVar7[3];
  }
  else {
    local_d8[0].field_2._0_8_ = *psVar12;
    local_d8[0]._M_dataplus._M_p = (pointer)*puVar7;
  }
  local_d8[0]._M_string_length = puVar7[1];
  *puVar7 = psVar12;
  puVar7[1] = 0;
  *(undefined1 *)psVar12 = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)local_d8);
  psVar12 = (size_type *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar12) {
    local_138.field_2._M_allocated_capacity = *psVar12;
    local_138.field_2._8_8_ = plVar6[3];
    local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
  }
  else {
    local_138.field_2._M_allocated_capacity = *psVar12;
    local_138._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_138._M_string_length = plVar6[1];
  *plVar6 = (long)psVar12;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  log_(pCVar17,&local_138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8[0]._M_dataplus._M_p != &local_d8[0].field_2) {
    operator_delete(local_d8[0]._M_dataplus._M_p,local_d8[0].field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != paVar1) {
    operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0[0]._M_dataplus._M_p != paVar13) {
    operator_delete(local_1b0[0]._M_dataplus._M_p,local_1b0[0].field_2._M_allocated_capacity + 1);
  }
  if (local_258 != (undefined1  [8])local_248) {
    operator_delete((void *)local_258,local_248[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
    operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
  }
  cv::Mat::Mat((Mat *)local_d8);
  cv::Mat::Mat((Mat *)local_1b0);
  cv::Mat::Mat(&this->originalImage_,&pCVar17->originalImage_);
  v = 0;
  iVar18 = 0;
  do {
    if ((pCVar17->vIterations_ <= v) && (pCVar17->hIterations_ <= iVar18)) {
      local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"");
      log_(pCVar17,&local_f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
      }
      cv::Mat::~Mat((Mat *)local_1b0);
      cv::Mat::~Mat((Mat *)local_d8);
      return this;
    }
    local_248[0]._M_allocated_capacity = 0;
    local_258._0_4_ = 0x1010000;
    local_2a8.field_2._M_allocated_capacity = 0;
    local_2a8._M_dataplus._M_p._0_4_ = 0x2010000;
    local_2a8._M_string_length = (size_type)local_d8;
    _Stack_250._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
    cv::cvtColor((cv *)local_258,(_InputArray *)&local_2a8,(_OutputArray *)0x6,0,(int)pvVar20);
    calculateEnergy((Carver *)local_258,&pCVar17->originalImage_);
    cv::Mat::operator=((Mat *)local_1b0,(Mat *)local_258);
    cv::Mat::~Mat((Mat *)local_258);
    if (iVar18 < pCVar17->hIterations_ && v < pCVar17->vIterations_) {
      local_2a8._M_dataplus._M_p = (pointer)0x0;
      local_2a8._M_string_length = 0;
      local_2a8.field_2._M_allocated_capacity = 0;
      local_278.field_2._M_allocated_capacity = 0;
      local_278._M_dataplus._M_p = (pointer)0x0;
      local_278._M_string_length = 0;
      local_258 = (undefined1  [8])0x0;
      _Stack_250._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      p_Var8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x58);
      p_Var8->_M_use_count = 1;
      p_Var8->_M_weak_count = 1;
      p_Var8->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00110760;
      p_Var8[1]._M_use_count = 0;
      p_Var8[1]._M_weak_count = 0;
      *(undefined4 *)&p_Var8[2]._vptr__Sp_counted_base = 0;
      *(undefined1 *)((long)&p_Var8[2]._vptr__Sp_counted_base + 4) = 0;
      p_Var8[2]._M_use_count = 0;
      p_Var8[3]._vptr__Sp_counted_base = (_func_int **)0x0;
      p_Var8[3]._M_use_count = 0;
      p_Var8[1]._vptr__Sp_counted_base = (_func_int **)&PTR___Async_state_impl_001107b0;
      p_Var9 = (_Result<std::vector<int,_std::allocator<int>_>_> *)operator_new(0x30);
      std::__future_base::_Result<std::vector<int,_std::allocator<int>_>_>::_Result(p_Var9);
      p_Var8[4]._vptr__Sp_counted_base = (_func_int **)p_Var9;
      *(Carver **)&p_Var8[4]._M_use_count = local_280;
      p_Var8[5]._vptr__Sp_counted_base = (_func_int **)local_1b0;
      local_1f0._M_dataplus._M_p = (pointer)0x0;
      local_1d0._M_dataplus._M_p = (pointer)operator_new(0x20);
      *(undefined ***)local_1d0._M_dataplus._M_p = &PTR___State_00110808;
      *(element_type **)((long)local_1d0._M_dataplus._M_p + 8) = (element_type *)(p_Var8 + 1);
      *(code **)((long)local_1d0._M_dataplus._M_p + 0x10) =
           std::__future_base::
           _Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jjstoo[P]seam-carver/src/carver.cpp:302:42)>_>,_std::vector<int,_std::allocator<int>_>_>
           ::_M_run;
      *(long *)((long)local_1d0._M_dataplus._M_p + 0x18) = 0;
      std::thread::_M_start_thread(&local_1f0,&local_1d0,0);
      if ((long *)local_1d0._M_dataplus._M_p != (long *)0x0) {
        (**(code **)(*(long *)local_1d0._M_dataplus._M_p + 8))();
      }
      if (p_Var8[3]._vptr__Sp_counted_base != (_func_int **)0x0) {
LAB_00109442:
        std::terminate();
      }
      p_Var8[3]._vptr__Sp_counted_base = (_func_int **)local_1f0._M_dataplus._M_p;
      local_258 = (undefined1  [8])(p_Var8 + 1);
      _Stack_250._M_pi = p_Var8;
      std::__basic_future<std::vector<int,_std::allocator<int>_>_>::__basic_future
                ((__basic_future<std::vector<int,_std::allocator<int>_>_> *)&local_118,
                 (__state_type *)local_258);
      if (_Stack_250._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_250._M_pi);
      }
      local_258 = (undefined1  [8])0x0;
      _Stack_250._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      pbVar10 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                operator_new(0x58);
      pbVar10->_M_string_length = 0x100000001;
      (pbVar10->_M_dataplus)._M_p = (pointer)&PTR___Sp_counted_ptr_inplace_00110848;
      *(undefined8 *)((long)&pbVar10->field_2 + 8) = 0;
      *(undefined4 *)&pbVar10[1]._M_dataplus._M_p = 0;
      *(undefined1 *)((long)&pbVar10[1]._M_dataplus._M_p + 4) = 0;
      *(undefined4 *)&pbVar10[1]._M_string_length = 0;
      pbVar10[1].field_2._M_allocated_capacity = 0;
      *(undefined4 *)((long)&pbVar10[1].field_2 + 8) = 0;
      (pbVar10->field_2)._M_allocated_capacity = (size_type)&PTR___Async_state_impl_00110898;
      p_Var9 = (_Result<std::vector<int,_std::allocator<int>_>_> *)operator_new(0x30);
      std::__future_base::_Result<std::vector<int,_std::allocator<int>_>_>::_Result(p_Var9);
      pbVar10[2]._M_dataplus._M_p = (pointer)p_Var9;
      pbVar10[2]._M_string_length = (size_type)local_280;
      pbVar10[2].field_2._M_allocated_capacity = (size_type)local_1b0;
      local_1f0._M_dataplus._M_p = (pointer)0x0;
      local_1f8 = (long *)operator_new(0x20);
      *local_1f8 = (long)&PTR___State_001108f0;
      local_1f8[1] = (long)&pbVar10->field_2;
      local_1f8[2] = (long)std::__future_base::
                           _Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jjstoo[P]seam-carver/src/carver.cpp:306:42)>_>,_std::vector<int,_std::allocator<int>_>_>
                           ::_M_run;
      local_1f8[3] = 0;
      std::thread::_M_start_thread(&local_1f0,&local_1f8,0);
      if (local_1f8 != (long *)0x0) {
        (**(code **)(*local_1f8 + 8))();
      }
      if (pbVar10[1].field_2._M_allocated_capacity != 0) goto LAB_00109442;
      pbVar10[1].field_2._M_allocated_capacity = (size_type)local_1f0._M_dataplus._M_p;
      local_258 = (undefined1  [8])&pbVar10->field_2;
      _Stack_250._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pbVar10;
      std::__basic_future<std::vector<int,_std::allocator<int>_>_>::__basic_future
                ((__basic_future<std::vector<int,_std::allocator<int>_>_> *)&local_1d0,
                 (__state_type *)local_258);
      pCVar17 = local_280;
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_250._M_pi !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_250._M_pi);
      }
      std::future<std::vector<int,_std::allocator<int>_>_>::get
                ((vector<int,_std::allocator<int>_> *)local_258,
                 (future<std::vector<int,_std::allocator<int>_>_> *)&local_118);
      uVar19 = local_2a8.field_2._M_allocated_capacity;
      _Var4._M_p = local_2a8._M_dataplus._M_p;
      local_2a8._M_dataplus._M_p = (pointer)local_258;
      local_2a8._M_string_length = (size_type)_Stack_250._M_pi;
      local_2a8.field_2._M_allocated_capacity = local_248[0]._M_allocated_capacity;
      local_258 = (undefined1  [8])0x0;
      _Stack_250._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_248[0]._M_allocated_capacity = 0;
      if ((_Var4._M_p != (pointer)0x0) &&
         (operator_delete(_Var4._M_p,uVar19 - (long)_Var4._M_p), local_258 != (undefined1  [8])0x0))
      {
        operator_delete((void *)local_258,local_248[0]._M_allocated_capacity - (long)local_258);
      }
      std::future<std::vector<int,_std::allocator<int>_>_>::get
                ((vector<int,_std::allocator<int>_> *)local_258,
                 (future<std::vector<int,_std::allocator<int>_>_> *)&local_1d0);
      uVar19 = local_278.field_2._M_allocated_capacity;
      _Var4._M_p = local_278._M_dataplus._M_p;
      local_278._M_dataplus._M_p = (pointer)local_258;
      local_278._M_string_length = (size_type)_Stack_250._M_pi;
      local_278.field_2._M_allocated_capacity = local_248[0]._M_allocated_capacity;
      local_258 = (undefined1  [8])0x0;
      _Stack_250._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_248[0]._M_allocated_capacity = 0;
      if ((_Var4._M_p != (pointer)0x0) &&
         (operator_delete(_Var4._M_p,uVar19 - (long)_Var4._M_p), local_258 != (undefined1  [8])0x0))
      {
        operator_delete((void *)local_258,local_248[0]._M_allocated_capacity - (long)local_258);
      }
      std::vector<int,_std::allocator<int>_>::vector
                (&local_150,(vector<int,_std::allocator<int>_> *)&local_2a8);
      pvVar20 = &local_48;
      pbVar10 = &local_278;
      std::vector<int,_std::allocator<int>_>::vector
                (pvVar20,(vector<int,_std::allocator<int>_> *)pbVar10);
      removeSeams((Carver *)local_258,(Mat *)pbVar10,(vector<int,_std::allocator<int>_> *)this,
                  &local_150);
      cv::Mat::operator=(&this->originalImage_,(Mat *)local_258);
      cv::Mat::~Mat((Mat *)local_258);
      if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_150.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_150.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_150.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_150.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d0._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d0._M_string_length);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._M_string_length);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete(local_278._M_dataplus._M_p,
                        local_278.field_2._M_allocated_capacity - (long)local_278._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a8._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete(local_2a8._M_dataplus._M_p,
                        local_2a8.field_2._M_allocated_capacity - (long)local_2a8._M_dataplus._M_p);
      }
      v = v + 1;
LAB_00109263:
      iVar18 = iVar18 + 1;
    }
    else if (v < pCVar17->vIterations_) {
      pbVar10 = &local_2a8;
      getSeamToRemove((vector<int,_std::allocator<int>_> *)pbVar10,pCVar17,(Mat *)local_1b0,VERTICAL
                     );
      std::vector<int,_std::allocator<int>_>::vector
                (&local_60,(vector<int,_std::allocator<int>_> *)pbVar10);
      removeVerticalSeam((Carver *)local_258,(Mat *)pbVar10,
                         (vector<int,_std::allocator<int>_> *)this);
      cv::Mat::operator=(&this->originalImage_,(Mat *)local_258);
      cv::Mat::~Mat((Mat *)local_258);
      if (local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a8._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete(local_2a8._M_dataplus._M_p,
                        local_2a8.field_2._M_allocated_capacity - (long)local_2a8._M_dataplus._M_p);
      }
      v = v + 1;
    }
    else if (iVar18 < pCVar17->hIterations_) {
      pbVar10 = &local_2a8;
      getSeamToRemove((vector<int,_std::allocator<int>_> *)pbVar10,pCVar17,(Mat *)local_1b0,
                      HORIZONTAL);
      std::vector<int,_std::allocator<int>_>::vector
                (&local_78,(vector<int,_std::allocator<int>_> *)pbVar10);
      removeHorizontalSeam
                ((Carver *)local_258,(Mat *)pbVar10,(vector<int,_std::allocator<int>_> *)this);
      cv::Mat::operator=(&this->originalImage_,(Mat *)local_258);
      cv::Mat::~Mat((Mat *)local_258);
      if (local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a8._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete(local_2a8._M_dataplus._M_p,
                        local_2a8.field_2._M_allocated_capacity - (long)local_2a8._M_dataplus._M_p);
      }
      goto LAB_00109263;
    }
    printStatus_(pCVar17,iVar18,v);
  } while( true );
}

Assistant:

cv::Mat Carver::carveImage() {
    // Set the iteration counters and max values
    int v = 0;
    int h = 0;

    if (!carveCount_) {
        vIterations_ = carveMode_ == BOTH || carveMode_ == VERTICAL ?
                    static_cast<int>(imageCols_ * carveAmount_) : 0;
        hIterations_ = carveMode_ == BOTH || carveMode_ == HORIZONTAL ?
                    static_cast<int>(imageRows_ * carveAmount_): 0;
    } else {
        vIterations_ = carveMode_ == BOTH || carveMode_ == VERTICAL ?
                    carveCount_ : 0;
        hIterations_ = carveMode_ == BOTH || carveMode_ == HORIZONTAL ?
                    carveCount_ : 0;

        if (!(hIterations_ < imageRows_) || !(vIterations_ < imageCols_))
            throw (out_of_range("Number of pixels to carve " +
                                to_string(carveCount_) +
                                " out of range for image of size " +
                                to_string(imageCols_) + "x" +
                                to_string(imageRows_)));
    }


    log_("Removing " + to_string(vIterations_) + " columns and " +
        to_string(hIterations_) + " rows");

    cv::Mat grayscale;
    cv::Mat energyMap;
    cv::Mat target = originalImage_;

    while(v < vIterations_ || h < hIterations_) {
        cv::cvtColor(target, grayscale, cv::COLOR_BGR2GRAY);
        energyMap = calculateEnergy(grayscale);
        if (v < vIterations_ && h < hIterations_) {
            vector<int> verticalSeam;
            vector<int> horizontalSeam;

            #ifdef CONCURRENT
            // Invoke asynchronous processing for seam pathfinding
            auto verticalSeamFuture =
                    async(launch::async, [this, &energyMap] {
                        return getSeamToRemove(energyMap, VERTICAL);
                    });
            auto horizontalSeamFuture =
                    async(launch::async, [this, &energyMap] {
                        return getSeamToRemove(energyMap, HORIZONTAL);
                    });

            // Synchronize
            verticalSeam = verticalSeamFuture.get();
            horizontalSeam = horizontalSeamFuture.get();

            #else
            verticalSeam = getSeamToRemove(energyMap, VERTICAL);
            horizontalSeam = getSeamToRemove(energyMap, HORIZONTAL);
            #endif

            target = removeSeams(target, verticalSeam, horizontalSeam);
            v++;
            h++;
        } else if (v < vIterations_) {
            vector<int> verticalSeam =
                    getSeamToRemove(energyMap, VERTICAL);
            target = removeVerticalSeam(target, verticalSeam);
            v++;
        } else if (h < hIterations_) {
            vector<int> horizontalSeam =
                    getSeamToRemove(energyMap, HORIZONTAL);
            target = removeHorizontalSeam(target, horizontalSeam);
            h++;
        }
        printStatus_(h, v);
    }
    log_("");
    return target;
}